

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O3

bool cmDependsFortran::CopyModule
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  size_type sVar8;
  bool bVar9;
  string *filename;
  size_t len;
  string mod_upper;
  string mod_lower;
  string mod_dir;
  string mod;
  string stamp;
  string compilerId;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pcVar3 = pbVar2[2]._M_dataplus._M_p;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar3,pcVar3 + pbVar2[2]._M_string_length);
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pcVar3 = pbVar2[3]._M_dataplus._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar3,pcVar3 + pbVar2[3]._M_string_length);
  paVar1 = &local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)paVar1;
  if (0x80 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)) {
    std::__cxx11::string::_M_assign((string *)&local_70);
  }
  _Var4._M_p = local_b0._M_dataplus._M_p;
  if (local_b0._M_string_length < 4) {
LAB_00378e03:
    std::__cxx11::string::append((char *)&local_b0);
  }
  else {
    iVar6 = strcmp(local_b0._M_dataplus._M_p + (local_b0._M_string_length - 4),".mod");
    if (iVar6 != 0) {
      if (local_b0._M_string_length != 4) {
        iVar6 = strcmp(_Var4._M_p + (local_b0._M_string_length - 5),".smod");
        if (iVar6 == 0) goto LAB_00378e14;
      }
      goto LAB_00378e03;
    }
  }
LAB_00378e14:
  cmsys::SystemTools::GetFilenamePath(&local_d0,&local_b0);
  if (local_d0._M_string_length == 0) {
    sVar8 = 0;
  }
  else {
    std::__cxx11::string::append((char *)&local_d0);
    sVar8 = local_d0._M_string_length;
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,local_d0._M_dataplus._M_p,local_d0._M_dataplus._M_p + sVar8);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,local_d0._M_dataplus._M_p,
             local_d0._M_dataplus._M_p + local_d0._M_string_length);
  cmsys::SystemTools::GetFilenameName(&local_50,&local_b0);
  cmFortranModuleAppendUpperLower(&local_50,&local_110,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  bVar5 = cmsys::SystemTools::FileExists(&local_110,true);
  if (bVar5) {
    bVar5 = ModulesDiffer(&local_110,&local_90,&local_70);
    bVar9 = true;
    if (!bVar5) goto LAB_003790a2;
    filename = &local_90;
    bVar5 = cmsys::SystemTools::CopyFileAlways(&local_110,filename);
    if (bVar5) goto LAB_003790a2;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error copying Fortran module from \"",0x23);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_110._M_dataplus._M_p,local_110._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" to \"",6);
  }
  else {
    filename = &local_f0;
    bVar5 = cmsys::SystemTools::FileExists(filename,true);
    if (bVar5) {
      bVar5 = ModulesDiffer(&local_f0,&local_90,&local_70);
      bVar9 = true;
      if (!bVar5) goto LAB_003790a2;
      filename = &local_90;
      bVar5 = cmsys::SystemTools::CopyFileAlways(&local_f0,filename);
      if (bVar5) goto LAB_003790a2;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error copying Fortran module from \"",0x23);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_f0._M_dataplus._M_p,local_f0._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" to \"",6);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error copying Fortran module \"",0x1e);
      pbVar2 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,pbVar2[2]._M_dataplus._M_p,
                          pbVar2[2]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".  Tried \"",0xb);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_110._M_dataplus._M_p,local_110._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" and \"",7);
    }
  }
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(filename->_M_dataplus)._M_p,filename->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".\n",3);
  bVar9 = false;
LAB_003790a2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return bVar9;
}

Assistant:

bool cmDependsFortran::CopyModule(const std::vector<std::string>& args)
{
  // Implements
  //
  //   $(CMAKE_COMMAND) -E cmake_copy_f90_mod input.mod output.mod.stamp
  //                                          [compiler-id]
  //
  // Note that the case of the .mod file depends on the compiler.  In
  // the future this copy could also account for the fact that some
  // compilers include a timestamp in the .mod file so it changes even
  // when the interface described in the module does not.

  std::string mod = args[2];
  std::string stamp = args[3];
  std::string compilerId;
  if (args.size() >= 5) {
    compilerId = args[4];
  }
  if (!cmHasLiteralSuffix(mod, ".mod") && !cmHasLiteralSuffix(mod, ".smod")) {
    // Support depend.make files left by older versions of CMake.
    // They do not include the ".mod" extension.
    mod += ".mod";
  }
  std::string mod_dir = cmSystemTools::GetFilenamePath(mod);
  if (!mod_dir.empty()) {
    mod_dir += "/";
  }
  std::string mod_upper = mod_dir;
  std::string mod_lower = mod_dir;
  cmFortranModuleAppendUpperLower(cmSystemTools::GetFilenameName(mod),
                                  mod_upper, mod_lower);
  if (cmSystemTools::FileExists(mod_upper, true)) {
    if (cmDependsFortran::ModulesDiffer(mod_upper, stamp, compilerId)) {
      if (!cmSystemTools::CopyFileAlways(mod_upper, stamp)) {
        std::cerr << "Error copying Fortran module from \"" << mod_upper
                  << "\" to \"" << stamp << "\".\n";
        return false;
      }
    }
    return true;
  }
  if (cmSystemTools::FileExists(mod_lower, true)) {
    if (cmDependsFortran::ModulesDiffer(mod_lower, stamp, compilerId)) {
      if (!cmSystemTools::CopyFileAlways(mod_lower, stamp)) {
        std::cerr << "Error copying Fortran module from \"" << mod_lower
                  << "\" to \"" << stamp << "\".\n";
        return false;
      }
    }
    return true;
  }

  std::cerr << "Error copying Fortran module \"" << args[2] << "\".  Tried \""
            << mod_upper << "\" and \"" << mod_lower << "\".\n";
  return false;
}